

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::request_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  undefined1 *puVar1;
  CVmHashTable *this_00;
  CVmHashEntry *pCVar2;
  vm_obj_id_t local_20;
  vm_obj_id_t local_1c;
  
  local_20 = obj;
  pCVar2 = CVmHashTable::find(this->post_load_init_table_,(char *)&local_20,4);
  if (pCVar2 == (CVmHashEntry *)0x0) {
    this_00 = this->post_load_init_table_;
    pCVar2 = (CVmHashEntry *)operator_new(0x30);
    local_1c = local_20;
    CVmHashEntry::CVmHashEntry(pCVar2,(char *)&local_1c,4,1);
    pCVar2->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00367ce8;
    *(vm_obj_id_t *)&pCVar2->field_0x24 = local_1c;
    *(undefined4 *)&pCVar2[1]._vptr_CVmHashEntry = 0;
    CVmHashTable::add(this_00,pCVar2);
    puVar1 = &this->pages_[local_20 >> 0xc][local_20 & 0xfff].field_0x14;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
  }
  return;
}

Assistant:

void CVmObjTable::request_post_load_init(vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* check for an existing entry - if there's not one already, add one */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));
    if (entry == 0)
    {
        /* it's not there yet - add a new entry */
        post_load_init_table_->add(new CVmHashEntryPLI(obj));

        /* mark the object as having requested post-load initialization */
        get_entry(obj)->requested_post_load_init_ = TRUE;
    }
}